

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void Luv24fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint local_38;
  int local_34;
  int Ce;
  int Le;
  int16_t *luv3;
  uint32_t *luv;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  _Ce = (short *)op;
  luv3 = (int16_t *)sp->tbuf;
  luv = (uint32_t *)n;
  while (0 < (long)luv) {
    if (*_Ce < 1) {
      local_34 = 0;
    }
    else if (*_Ce < 0x1cf2) {
      if (sp->encode_meth == 0) {
        local_34 = *_Ce + -0xcf2 >> 2;
      }
      else {
        local_34 = tiff_itrunc(((double)(int)*_Ce - 3314.0) * 0.25,sp->encode_meth);
      }
    }
    else {
      local_34 = 0x3ff;
    }
    local_38 = uv_encode(((double)(int)_Ce[1] + 0.5) / 32768.0,((double)(int)_Ce[2] + 0.5) / 32768.0
                         ,sp->encode_meth);
    if ((int)local_38 < 0) {
      local_38 = uv_encode(0.210526316,0.473684211,0);
    }
    *(uint *)luv3 = local_34 << 0xe | local_38;
    _Ce = _Ce + 3;
    luv3 = luv3 + 2;
    luv = (uint32_t *)((long)luv + -1);
  }
  return;
}

Assistant:

static void Luv24fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        int Le, Ce;

        if (luv3[0] <= 0)
            Le = 0;
        else if (luv3[0] >= (1 << 12) + 3314)
            Le = (1 << 10) - 1;
        else if (sp->encode_meth == SGILOGENCODE_NODITHER)
            Le = (luv3[0] - 3314) >> 2;
        else
            Le = tiff_itrunc(.25 * (luv3[0] - 3314.), sp->encode_meth);

        Ce = uv_encode((luv3[1] + .5) / (1 << 15), (luv3[2] + .5) / (1 << 15),
                       sp->encode_meth);
        if (Ce < 0) /* never happens */
            Ce = uv_encode(U_NEU, V_NEU, SGILOGENCODE_NODITHER);
        *luv++ = (uint32_t)Le << 14 | Ce;
        luv3 += 3;
    }
}